

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O1

void __thiscall NoiseSource::~NoiseSource(NoiseSource *this)

{
  size_type *this_00;
  
  this_00 = &this[-1].super_StochasticProcess.super_Physical.physicalUnit.sUnitSymbol.
             _M_string_length;
  ~NoiseSource((NoiseSource *)this_00);
  operator_delete(this_00,0x168);
  return;
}

Assistant:

NoiseSource::~NoiseSource()
{
	// noises array
	for(int i=0; i<nNoises; ++i)
		if(aNoises[i])
			delete aNoises[i];
	delete[] aNoises;
	
	// mixing array
	for(int i=0; i<nNoises; i++)
		delete[] aA[i];
	delete[] aA;
	
	// omega array
	delete[] aOmega;
}